

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

VirtualIterator<Kernel::Term_*>
Lib::getUniquePersistentIterator<Lib::VirtualIterator<Kernel::Term*>>
          (VirtualIterator<Kernel::Term_*> *it)

{
  bool bVar1;
  IteratorCore<Kernel::Term_*> *in_RDI;
  IteratorCore<Kernel::Term_*> *in_stack_ffffffffffffffb8;
  UniquePersistentIterator<Lib::VirtualIterator<Kernel::Term_*>_> *in_stack_ffffffffffffffe0;
  
  bVar1 = VirtualIterator<Kernel::Term_*>::hasNext((VirtualIterator<Kernel::Term_*> *)0x851ded);
  if (bVar1) {
    ::operator_new(0x20);
    UniquePersistentIterator<Lib::VirtualIterator<Kernel::Term_*>_>::UniquePersistentIterator
              (in_stack_ffffffffffffffe0,(VirtualIterator<Kernel::Term_*> *)in_RDI);
    vi<Kernel::Term*>(in_stack_ffffffffffffffb8);
  }
  else {
    VirtualIterator<Kernel::Term_*>::getEmpty();
  }
  return (VirtualIterator<Kernel::Term_*>)in_RDI;
}

Assistant:

inline
VirtualIterator<ELEMENT_TYPE(Inner)> getUniquePersistentIterator(Inner it)
{
  if(!it.hasNext()) {
    return VirtualIterator<ELEMENT_TYPE(Inner)>::getEmpty();
  }
  return vi( new UniquePersistentIterator<Inner>(it) );
}